

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRange.cxx
# Opt level: O3

int testRange(int param_1,char **param_2)

{
  cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
  *pcVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  ostream *poVar5;
  int iVar6;
  long *plVar7;
  long lVar8;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  vector<int,_std::allocator<int>_> testData;
  vector<int,_std::allocator<int>_> evenData;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringRange;
  allocator_type local_101;
  vector<int,_std::allocator<int>_> local_100;
  vector<int,_std::allocator<int>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  undefined1 local_88 [16];
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  int local_68 [4];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long *local_38 [2];
  long local_28 [2];
  
  local_a8._0_8_ = (int *)0x600000005;
  local_a8._8_8_ =
       (cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
        *)0x800000007;
  local_b8._0_8_ =
       (cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
        *)0x200000001;
  local_b8._8_8_ =
       (cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
        *)0x400000003;
  local_98._M_current = (int *)0xa00000009;
  __l._M_len = 10;
  __l._M_array = (iterator)local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_100,__l,(allocator_type *)&local_e8);
  piVar3 = local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar2 = local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar6 = 0x16;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(!cmMakeRange(testData).empty()) failed on line ",
               0x3b);
  }
  else if ((long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start == 0x28) {
    pcVar1 = (cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
              *)((long)&(((TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>
                           *)((long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + 0x10))->Base)._M_current + 4)
    ;
    if (pcVar1 == (cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
                   *)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
      iVar6 = 0x19;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(!cmMakeRange(testData).advance(5).empty()) failed on line ",0x46);
    }
    else if ((long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pcVar1 == 0x14) {
      if (pcVar1 == (cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
                     *)&(((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
                           *)((long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish + -0x20))->Begin).field_0xc) {
        bVar4 = cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                ::any_of<testRange(int,char**)::__0>
                          ((cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                            *)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                           local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        if (bVar4) {
          bVar4 = cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ::all_of<testRange(int,char**)::__1>
                            ((cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                              *)piVar2,piVar3);
          if (bVar4) {
            bVar4 = cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    ::none_of<testRange(int,char**)::__2>
                              ((cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                                *)piVar2,piVar3);
            if (bVar4) {
              local_b8._0_8_ = (int *)0x400000002;
              local_b8._8_8_ = (int *)0x800000006;
              local_a8._0_4_ = 10;
              __l_00._M_len = 5;
              __l_00._M_array = (iterator)local_b8;
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_e8,__l_00,(allocator_type *)&local_d0);
              local_b8._0_8_ =
                   local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              while (((pointer)local_b8._0_8_ !=
                      local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish &&
                     (((ulong)(((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
                                 *)local_b8._0_8_)->Begin).Base._M_current & 1) != 0))) {
                local_b8._0_8_ =
                     (long)&(((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
                               *)local_b8._0_8_)->Begin).Base._M_current + 4;
              }
              local_b8._8_8_ =
                   local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_a8._8_8_ =
                   local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_98._M_current =
                   local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              bVar4 = operator==((cmRange<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>_>
                                  *)local_b8,
                                 (cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
              if (bVar4) {
                local_b8._0_8_ = local_a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"1","");
                local_98._M_current = (int *)local_88;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"2","");
                local_78._M_current = local_68;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"3","");
                local_58[0] = local_48;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"4","");
                plVar7 = local_28;
                local_38[0] = plVar7;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"5","");
                __l_01._M_len = 5;
                __l_01._M_array = (iterator)local_b8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_d0,__l_01,&local_101);
                lVar8 = -0xa0;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                bVar4 = operator==((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
                                    *)local_100.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                   (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)&(((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
                                          *)((long)local_100.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish + -0x20
                                            ))->Begin).field_0xc);
                if (!bVar4) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(cmMakeRange(testData) .transform([](int n) { return std::to_string(n); }) .retreat(5) == cmMakeRange(stringRange)) failed on line "
                             ,0x8e);
                  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0x2a);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_d0);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(cmMakeRange(testData).filter([](int n) { return n % 2 == 0; }) == cmMakeRange(evenData)) failed on line "
                           ,0x74);
                poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0x25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
              }
              if ((cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                   *)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                  (cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                   *)0x0) {
                operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage -
                                (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
              }
              goto LAB_0013dd58;
            }
            iVar6 = 0x21;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(cmMakeRange(testData).none_of([](int n) { return n > 11; })) failed on line "
                       ,0x58);
          }
          else {
            iVar6 = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(cmMakeRange(testData).all_of([](int n) { return n < 11; })) failed on line "
                       ,0x57);
          }
        }
        else {
          iVar6 = 0x1f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(cmMakeRange(testData).any_of([](int n) { return n % 3 == 0; })) failed on line "
                     ,0x5b);
        }
      }
      else {
        iVar6 = 0x1c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).empty()) failed on line "
                   ,0x50);
      }
    }
    else {
      iVar6 = 0x1a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(cmMakeRange(testData).advance(5).size() == 5) failed on line ",0x49);
    }
  }
  else {
    iVar6 = 0x17;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(cmMakeRange(testData).size() == 10) failed on line ",0x3f);
  }
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
LAB_0013dd58:
  if ((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
       *)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
      (cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
       *)0x0) {
    operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int testRange(int /*unused*/, char* /*unused*/ [])
{
  std::vector<int> const testData = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10 };

  ASSERT_TRUE(!cmMakeRange(testData).empty());
  ASSERT_TRUE(cmMakeRange(testData).size() == 10);

  ASSERT_TRUE(!cmMakeRange(testData).advance(5).empty());
  ASSERT_TRUE(cmMakeRange(testData).advance(5).size() == 5);

  ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).empty());
  ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).size() == 0);

  ASSERT_TRUE(cmMakeRange(testData).any_of([](int n) { return n % 3 == 0; }));
  ASSERT_TRUE(cmMakeRange(testData).all_of([](int n) { return n < 11; }));
  ASSERT_TRUE(cmMakeRange(testData).none_of([](int n) { return n > 11; }));

  std::vector<int> const evenData = { 2, 4, 6, 8, 10 };
  ASSERT_TRUE(cmMakeRange(testData).filter([](int n) { return n % 2 == 0; }) ==
              cmMakeRange(evenData));

  std::vector<std::string> const stringRange = { "1", "2", "3", "4", "5" };
  ASSERT_TRUE(cmMakeRange(testData)
                .transform([](int n) { return std::to_string(n); })
                .retreat(5) == cmMakeRange(stringRange));

  return 0;
}